

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

double EDCircles::computeEllipsePerimeter(EllipseEquation *eq)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double P2;
  double tmpY;
  double tmpX;
  bool rotation;
  double h;
  double b;
  double a;
  double cY;
  double cX;
  double F3;
  double E3;
  double D3;
  double theta;
  double F2;
  double E2;
  double D2;
  double C2;
  double B2;
  double A2;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  double mult;
  EllipseEquation *eq_local;
  
  dVar2 = EllipseEquation::A(eq);
  dVar2 = dVar2 * 1.0;
  dVar3 = EllipseEquation::B(eq);
  dVar4 = EllipseEquation::C(eq);
  dVar5 = EllipseEquation::D(eq);
  dVar6 = EllipseEquation::E(eq);
  dVar7 = EllipseEquation::F(eq);
  bVar1 = false;
  dVar3 = (dVar3 * 1.0) / dVar2;
  dVar4 = (dVar4 * 1.0) / dVar2;
  dVar5 = (dVar5 * 1.0) / dVar2;
  dVar6 = (dVar6 * 1.0) / dVar2;
  dVar7 = (dVar7 * 1.0) / dVar2;
  dVar2 = dVar2 / dVar2;
  if (((dVar3 != 0.0) ||
      (dVar8 = dVar7, dVar17 = dVar6, dVar15 = dVar5, dVar12 = dVar4, dVar9 = dVar2, NAN(dVar3))) &&
     ((dVar3 != 0.0 ||
      (dVar8 = theta, dVar17 = F2, dVar15 = E2, dVar12 = D2, dVar9 = B2, NAN(dVar3))))) {
    bVar1 = true;
    dVar8 = atan(dVar3 / (dVar2 - dVar4));
    D3 = dVar8 / 2.0;
    dVar9 = cos(D3 * 2.0);
    dVar10 = sin(D3 * 2.0);
    dVar11 = cos(D3 * 2.0);
    sin(D3 * 2.0);
    cos(D3 * 2.0);
    dVar12 = cos(D3 * 2.0);
    dVar13 = sin(D3 * 2.0);
    dVar14 = cos(D3 * 2.0);
    dVar15 = cos(D3);
    dVar16 = sin(D3);
    dVar17 = sin(D3);
    dVar18 = cos(D3);
    dVar8 = dVar7;
    dVar17 = -dVar5 * dVar17 + dVar6 * dVar18;
    dVar15 = dVar5 * dVar15 + dVar6 * dVar16;
    dVar12 = dVar2 * (dVar4 * (dVar14 + 1.0) + -dVar3 * dVar13 + (1.0 - dVar12)) * 0.5;
    dVar9 = dVar2 * (dVar4 * (1.0 - dVar11) + dVar3 * dVar10 + dVar9 + 1.0) * 0.5;
  }
  B2 = dVar9;
  D2 = dVar12;
  E2 = dVar15;
  F2 = dVar17;
  theta = dVar8;
  dVar3 = pow(-((E2 / B2) / 2.0),2.0);
  dVar4 = pow(-((F2 / D2) / 2.0),2.0);
  dVar3 = (B2 * dVar3 + D2 * dVar4) - theta;
  dVar4 = sqrt(dVar3 / B2);
  dVar3 = sqrt(dVar3 / D2);
  if (bVar1) {
    cos(D3);
    sin(D3);
    sin(D3);
    cos(D3);
  }
  dVar5 = pow(dVar4 - dVar3,2.0);
  dVar6 = pow(dVar4 + dVar3,2.0);
  dVar7 = sqrt((dVar5 / dVar6) * -3.0 + 4.0);
  return (dVar4 + dVar3) * 3.14159265 * (((dVar5 / dVar6) * 3.0) / (dVar7 + 10.0) + 1.0);
}

Assistant:

double EDCircles::computeEllipsePerimeter(EllipseEquation * eq)
{
	double mult = 1;

	double A = eq->A()*mult;
	double B = eq->B()*mult;
	double C = eq->C()*mult;
	double D = eq->D()*mult;
	double E = eq->E()*mult;
	double F = eq->F()*mult;

	double A2, B2, C2, D2, E2, F2, theta;  //rotated coefficients
	double			   D3, E3, F3;             //ellipse form coefficients
	double cX, cY, a, b;		               //(cX,cY) center, a & b: semimajor & semiminor axes
	double h;							                 //h = (a-b)^2 / (a+b)^2
	bool rotation = false;

#define pi 3.14159265

	//Normalize coefficients
	B /= A; C /= A; D /= A; E /= A; F /= A; A /= A;

	if (B == 0) //Then not need to rotate the axes
	{
		A2 = A;
		B2 = B;
		C2 = C;
		D2 = D;
		E2 = E;
		F2 = F;

	}

	else if (B != 0) //Rotate the axes
	{
		rotation = true;

		//Determine the rotation angle (in radians)
		theta = atan(B / (A - C)) / 2;

		//Compute the coefficients wrt the new coordinate system 
		A2 = 0.5 * (A * (1 + cos(2 * theta) + B * sin(2 * theta) + C * (1 - cos(2 * theta))));

		B2 = (C - A) * sin(2 * theta) + B * cos(2 * theta); //B2 should turn to be zero?

		C2 = 0.5 * (A * (1 - cos(2 * theta) - B * sin(2 * theta) + C * (1 + cos(2 * theta))));

		D2 = D * cos(theta) + E * sin(theta);

		E2 = -D * sin(theta) + E * cos(theta);

		F2 = F;
	}

	//Transform the conic equation into the ellipse form
	D3 = D2 / A2; //normalize x term's coef 
				  //A3 = 1;     //A2 / A2

	E3 = E2 / C2; //normalize y term's coef
				  //C3 = 1;     //C2 / C2

	cX = -(D3 / 2);	//center X
	cY = -(E3 / 2);	//center Y

	F3 = A2 * pow(cX, 2.0) + C2 * pow(cY, 2.0) - F2;

	//semimajor axis
	a = sqrt(F3 / A2);
	//semiminor axis
	b = sqrt(F3 / C2);

	//Center coordinates have to be re-transformed if rotation is applied!
	if (rotation)
	{
		double tmpX = cX, tmpY = cY;
		cX = tmpX * cos(theta) - tmpY * sin(theta);
		cY = tmpX * sin(theta) + tmpY * cos(theta);
	}

	//Perimeter Computation(s)
	h = pow((a - b), 2.0) / pow((a + b), 2.0);

	//Ramajunan I
	//double P1 = pi * (a + b) * (3 - sqrt(4 - h));
	///printf("Perimeter of the ellipse is %.5f (Ramajunan I)\n", P1);

	//Ramajunan II
	double P2 = pi * (a + b) * (1 + 3 * h / (10 + sqrt(4 - 3 * h)));
	//	printf("Perimeter of the ellipse is %.5f (Ramajunan II)\n", P2);

	//  High-school formula
	//	double P3 = 2 * pi * sqrt(0.5 * (a*a + b*b));
	//	printf("Perimeter of the ellipse is %.5f (simple formula)\n", P3);

	return P2;
#undef pi
}